

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

bool __thiscall
vkt::shaderexecutor::
InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>
::operator()(InputLess<vkt::shaderexecutor::InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>_>
             *this,InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                   *in1,
            InTuple<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
            *in2)

{
  bool bVar1;
  Vector<float,_2> *val1;
  bool bVar2;
  Vector<float,_2> *val2;
  InputLess<tcu::Vector<float,_4>_> local_1a;
  InputLess<tcu::Vector<float,_4>_> local_19;
  
  bVar1 = InputLess<tcu::Vector<float,_4>_>::operator()
                    (&local_1a,(Vector<float,_4> *)in1,(Vector<float,_4> *)in2);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = InputLess<tcu::Vector<float,_4>_>::operator()
                      (&local_19,(Vector<float,_4> *)in2,(Vector<float,_4> *)in1);
    if (!bVar1) {
      val1 = &(in1->
              super_Tuple4<tcu::Vector<float,_4>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>
              ).b;
      val2 = &(in2->
              super_Tuple4<tcu::Vector<float,_4>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>
              ).b;
      bVar1 = inputLess<tcu::Vector<float,2>>(val1,val2);
      if (bVar1) {
        return true;
      }
      inputLess<tcu::Vector<float,2>>(val2,val1);
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool operator() (const InTuple<In>& in1, const InTuple<In>& in2) const
	{
		if (inputLess(in1.a, in2.a))
			return true;
		if (inputLess(in2.a, in1.a))
			return false;
		if (inputLess(in1.b, in2.b))
			return true;
		if (inputLess(in2.b, in1.b))
			return false;
		if (inputLess(in1.c, in2.c))
			return true;
		if (inputLess(in2.c, in1.c))
			return false;
		if (inputLess(in1.d, in2.d))
			return true;
		return false;
	}